

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

uint32_t __thiscall cfd::TransactionContext::AddTxIn(TransactionContext *this,OutPoint *outpoint)

{
  uint uVar1;
  uint32_t uVar2;
  Txid TStack_38;
  
  cfd::core::OutPoint::GetTxid();
  uVar1 = cfd::core::OutPoint::GetVout();
  uVar2 = GetDefaultSequence(this);
  uVar2 = cfd::core::Transaction::AddTxIn
                    ((Txid *)this,(uint)&TStack_38,uVar1,(Script *)(ulong)uVar2);
  core::Txid::~Txid(&TStack_38);
  return uVar2;
}

Assistant:

uint32_t TransactionContext::AddTxIn(const OutPoint& outpoint) {
  return AddTxIn(
      outpoint.GetTxid(), outpoint.GetVout(), GetDefaultSequence(),
      Script::Empty);
}